

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O2

void __thiscall Nes_Vrc6_Apu::Nes_Vrc6_Apu(Nes_Vrc6_Apu *this)

{
  Blip_Synth<8,_1>::Blip_Synth(&this->saw_synth);
  Blip_Synth<12,_1>::Blip_Synth(&this->square_synth);
  output(this,(Blip_Buffer *)0x0);
  volume(this,1.0);
  reset(this);
  return;
}

Assistant:

Nes_Vrc6_Apu::Nes_Vrc6_Apu()
{
	output( NULL );
	volume( 1.0 );
	reset();
}